

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O2

double Open_JTalk_get_gv_weight(Open_JTalk *open_jtalk,size_t i,_Bool *error)

{
  double dVar1;
  
  if (error == (_Bool *)0x0) {
    if (i < 2 && open_jtalk != (Open_JTalk *)0x0) goto LAB_0014f38d;
  }
  else {
    *error = false;
    if ((open_jtalk != (Open_JTalk *)0x0) && (i < 2)) {
LAB_0014f38d:
      dVar1 = HTS_Engine_get_gv_weight(&open_jtalk->engine,i);
      return dVar1;
    }
    *error = true;
  }
  return 0.0;
}

Assistant:

double Open_JTalk_get_gv_weight(Open_JTalk *open_jtalk, size_t i, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	if (i != 0 && i != 1)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return HTS_Engine_get_gv_weight(&open_jtalk->engine, i);
}